

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

int __thiscall
TPZSFMatrix<long_double>::Resize(TPZSFMatrix<long_double> *this,int64_t newDim,int64_t param_2)

{
  longdouble *plVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  ulong uVar7;
  
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (CONCAT44(extraout_var,iVar2) != newDim) {
    uVar3 = ((newDim + 1) * newDim) / 2;
    iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x4b])();
    plVar4 = (longdouble *)operator_new__(-(ulong)(uVar3 >> 0x3c != 0) | uVar3 * 0x10);
    uVar7 = CONCAT44(extraout_var_00,iVar2);
    if ((long)uVar3 < (long)CONCAT44(extraout_var_00,iVar2)) {
      uVar7 = uVar3;
    }
    plVar1 = this->fElem;
    plVar5 = plVar4;
    for (plVar6 = plVar1; plVar6 < plVar1 + uVar7; plVar6 = plVar6 + 1) {
      *plVar5 = *plVar6;
      plVar5 = plVar5 + 1;
    }
    for (; plVar5 < plVar4 + uVar3; plVar5 = plVar5 + 1) {
      *plVar5 = (longdouble)0;
    }
    if (plVar1 != (longdouble *)0x0) {
      operator_delete(plVar1,0x10);
    }
    this->fElem = plVar4;
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = newDim;
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = newDim;
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Resize( int64_t newDim , int64_t )
{
	if ( newDim == this->Dim() )
		return( 1 );
	
	int64_t newSize = newDim * (newDim + 1) / 2;
	int64_t oldSize = Size();
	TVar *newElem = new TVar[newSize] ;
	if ( newElem == NULL )
		return TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Resize <memory allocation error>." );
	
	int64_t minSize  = Min( newSize, oldSize );
	TVar *src = fElem;
	TVar *dst = newElem;
	TVar *end = &fElem[ minSize ];
	
	// Copia os elementos antigos para a nova matriz.
	while ( src < end )
		*dst++ = *src++;
	
	// Preenche os elementos que sobrarem (se sobrarem) com ZEROS.
	end = &newElem[ newSize ];
	while ( dst < end )
		*dst++ = 0.0;
	
	if ( fElem != NULL )
		delete( fElem );
	fElem = newElem;
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}